

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asio_service_test.cxx
# Opt level: O0

int asio_service_test::global_mgr_heavy_test(void)

{
  initializer_list<std::shared_ptr<nuraft::buffer>_> __l;
  bool bVar1;
  int iVar2;
  void *pvVar3;
  ostream *poVar4;
  size_t sVar5;
  element_type *this;
  int __how;
  int __fd;
  allocator<char> *this_00;
  RaftAsioPkg *pkg_2;
  RaftAsioPkg **entry_2;
  iterator __end1_1;
  iterator __begin1_1;
  vector<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_> *__range1_1;
  RaftAsioPkg *pkg_1;
  RaftAsioPkg **entry_1;
  iterator __end2;
  iterator __begin2;
  vector<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_> *__range2;
  buffer_serializer bs;
  ptr<buffer> msg;
  string msg_str;
  size_t ii_1;
  raft_params param;
  RaftAsioPkg *pp;
  RaftAsioPkg **entry;
  iterator __end1;
  iterator __begin1;
  vector<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_> *__range1;
  int _v;
  RaftAsioPkg *pkg;
  string addr;
  size_t ii;
  vector<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_> pkgs;
  size_t NUM_SERVERS;
  nuraft_global_config g_config;
  string *in_stack_fffffffffffffb58;
  RaftAsioPkg *in_stack_fffffffffffffb60;
  allocator *paVar6;
  string *in_stack_fffffffffffffb68;
  RaftAsioPkg *pRVar7;
  raft_server *in_stack_fffffffffffffb70;
  allocator_type *in_stack_fffffffffffffb88;
  vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
  *in_stack_fffffffffffffb90;
  vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
  *in_stack_fffffffffffffb98;
  vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
  *in_stack_fffffffffffffba0;
  raft_server *in_stack_fffffffffffffbc8;
  raft_server *in_stack_fffffffffffffbd0;
  size_t in_stack_fffffffffffffca8;
  allocator local_301;
  string local_300 [32];
  RaftAsioPkg *local_2e0;
  reference local_2d8;
  RaftAsioPkg **local_2d0;
  __normal_iterator<RaftAsioPkg_**,_std::vector<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_>_>
  in_stack_fffffffffffffd38;
  undefined8 in_stack_fffffffffffffd40;
  vector<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_> *in_stack_fffffffffffffd48;
  undefined1 local_288 [24];
  undefined8 local_270;
  undefined8 local_240;
  undefined8 local_238;
  RaftAsioPkg **local_230;
  __normal_iterator<RaftAsioPkg_**,_std::vector<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_>_>
  local_228;
  undefined1 *local_220;
  string local_1f0 [32];
  ulong local_1d0;
  undefined4 local_170;
  RaftAsioPkg *local_160;
  reference local_158;
  RaftAsioPkg **local_150;
  __normal_iterator<RaftAsioPkg_**,_std::vector<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_>_>
  local_148 [2];
  allocator local_131;
  string local_130 [36];
  undefined4 local_10c;
  native_handle_type local_108;
  char local_fd;
  int local_fc;
  string local_f8 [84];
  int local_a4;
  void *local_a0;
  string local_88 [32];
  string local_68 [32];
  ulong local_48;
  undefined1 local_40 [24];
  undefined8 local_28;
  nuraft_global_config local_20;
  undefined4 local_4;
  
  raft_functional_common::reset_log_files();
  nuraft::nuraft_global_config::nuraft_global_config(&local_20);
  local_20.num_commit_threads_ = 2;
  local_20.num_append_threads_ = 2;
  nuraft::nuraft_global_mgr::init((EVP_PKEY_CTX *)&local_20);
  local_28 = 0x32;
  std::vector<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_>::vector
            ((vector<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_> *)0x1b2397);
  for (local_48 = 0; local_48 < 0x32; local_48 = local_48 + 1) {
    std::__cxx11::to_string((unsigned_long)in_stack_fffffffffffffb98);
    std::operator+((char *)in_stack_fffffffffffffb68,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffb60);
    std::__cxx11::string::~string(local_88);
    pvVar3 = operator_new(0x120);
    RaftAsioPkg::RaftAsioPkg
              ((RaftAsioPkg *)in_stack_fffffffffffffb70,
               (int)((ulong)in_stack_fffffffffffffb68 >> 0x20),(string *)in_stack_fffffffffffffb60);
    local_a0 = pvVar3;
    std::vector<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_>::push_back
              ((vector<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_> *)in_stack_fffffffffffffb70,
               (value_type *)in_stack_fffffffffffffb68);
    std::__cxx11::string::~string(local_68);
  }
  nuraft::raft_server::init_options::init_options((init_options *)in_stack_fffffffffffffb60);
  iVar2 = launch_servers(in_stack_fffffffffffffd48,SUB81((ulong)in_stack_fffffffffffffd40 >> 0x38,0)
                         ,SUB81((ulong)in_stack_fffffffffffffd40 >> 0x30,0),
                         SUB81((ulong)in_stack_fffffffffffffd40 >> 0x28,0),
                         (init_options *)in_stack_fffffffffffffd38._M_current);
  nuraft::raft_server::init_options::~init_options((init_options *)0x1b254c);
  local_a4 = iVar2;
  if (iVar2 == 0) {
    paVar6 = &local_131;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_130,"wait for Raft group ready",paVar6);
    TestSuite::sleep_sec((size_t)in_stack_fffffffffffffb60,in_stack_fffffffffffffb58);
    std::__cxx11::string::~string(local_130);
    std::allocator<char>::~allocator((allocator<char> *)&local_131);
    local_148[1]._M_current = (RaftAsioPkg **)local_40;
    local_148[0]._M_current =
         (RaftAsioPkg **)
         std::vector<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_>::begin
                   ((vector<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_> *)
                    in_stack_fffffffffffffb58);
    local_150 = (RaftAsioPkg **)
                std::vector<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_>::end
                          ((vector<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_> *)
                           in_stack_fffffffffffffb58);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<RaftAsioPkg_**,_std::vector<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_>_>
                          *)in_stack_fffffffffffffb60,
                         (__normal_iterator<RaftAsioPkg_**,_std::vector<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_>_>
                          *)in_stack_fffffffffffffb58);
      if (!bVar1) break;
      local_158 = __gnu_cxx::
                  __normal_iterator<RaftAsioPkg_**,_std::vector<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_>_>
                  ::operator*(local_148);
      local_160 = *local_158;
      std::__shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x1b2b46);
      nuraft::raft_server::get_current_params(in_stack_fffffffffffffb70);
      local_170 = 1;
      std::__shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x1b2b74);
      nuraft::raft_server::update_params
                (in_stack_fffffffffffffbd0,(raft_params *)in_stack_fffffffffffffbc8);
      __gnu_cxx::
      __normal_iterator<RaftAsioPkg_**,_std::vector<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_>_>
      ::operator++(local_148);
    }
    for (local_1d0 = 0; local_1d0 < 500; local_1d0 = local_1d0 + 1) {
      std::__cxx11::to_string((unsigned_long)in_stack_fffffffffffffb98);
      std::__cxx11::string::size();
      nuraft::buffer::alloc(in_stack_fffffffffffffca8);
      nuraft::buffer_serializer::buffer_serializer
                ((buffer_serializer *)in_stack_fffffffffffffb70,
                 (ptr<buffer> *)in_stack_fffffffffffffb68,
                 (endianness)((ulong)in_stack_fffffffffffffb60 >> 0x20));
      nuraft::buffer_serializer::put_str
                ((buffer_serializer *)in_stack_fffffffffffffb70,in_stack_fffffffffffffb68);
      local_220 = local_40;
      local_228._M_current =
           (RaftAsioPkg **)
           std::vector<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_>::begin
                     ((vector<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_> *)
                      in_stack_fffffffffffffb58);
      local_230 = (RaftAsioPkg **)
                  std::vector<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_>::end
                            ((vector<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_> *)
                             in_stack_fffffffffffffb58);
      while( true ) {
        bVar1 = __gnu_cxx::operator!=
                          ((__normal_iterator<RaftAsioPkg_**,_std::vector<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_>_>
                            *)in_stack_fffffffffffffb60,
                           (__normal_iterator<RaftAsioPkg_**,_std::vector<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_>_>
                            *)in_stack_fffffffffffffb58);
        if (!bVar1) break;
        local_238 = __gnu_cxx::
                    __normal_iterator<RaftAsioPkg_**,_std::vector<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_>_>
                    ::operator*(&local_228);
        local_240 = *(undefined8 *)local_238;
        std::__shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x1b2cfc);
        std::shared_ptr<nuraft::buffer>::shared_ptr
                  ((shared_ptr<nuraft::buffer> *)in_stack_fffffffffffffb60,
                   (shared_ptr<nuraft::buffer> *)in_stack_fffffffffffffb58);
        local_270 = 1;
        local_288._16_8_ = (pointer)local_288;
        std::allocator<std::shared_ptr<nuraft::buffer>_>::allocator
                  ((allocator<std::shared_ptr<nuraft::buffer>_> *)0x1b2d46);
        __l._M_len = (size_type)in_stack_fffffffffffffba0;
        __l._M_array = (iterator)in_stack_fffffffffffffb98;
        std::
        vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>::
        vector(in_stack_fffffffffffffb90,__l,in_stack_fffffffffffffb88);
        nuraft::raft_server::append_entries
                  (in_stack_fffffffffffffbc8,
                   (vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
                    *)paVar6);
        std::
        shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>
        ::~shared_ptr((shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>
                       *)0x1b2d93);
        std::
        vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>::
        ~vector((vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
                 *)in_stack_fffffffffffffb70);
        std::allocator<std::shared_ptr<nuraft::buffer>_>::~allocator
                  ((allocator<std::shared_ptr<nuraft::buffer>_> *)0x1b2dad);
        in_stack_fffffffffffffb98 =
             (vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
              *)local_288;
        in_stack_fffffffffffffb90 =
             (vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
              *)(local_288 + 0x10);
        do {
          in_stack_fffffffffffffb90 =
               (vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
                *)((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(in_stack_fffffffffffffb90 + -1) +
                  1);
          std::shared_ptr<nuraft::buffer>::~shared_ptr((shared_ptr<nuraft::buffer> *)0x1b2dd6);
        } while (in_stack_fffffffffffffb90 != in_stack_fffffffffffffb98);
        in_stack_fffffffffffffba0 = in_stack_fffffffffffffb90;
        __gnu_cxx::
        __normal_iterator<RaftAsioPkg_**,_std::vector<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_>_>
        ::operator++(&local_228);
      }
      std::shared_ptr<nuraft::buffer>::~shared_ptr((shared_ptr<nuraft::buffer> *)0x1b2ec0);
      std::__cxx11::string::~string(local_1f0);
    }
    in_stack_fffffffffffffb70 = (raft_server *)&stack0xfffffffffffffd4f;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&stack0xfffffffffffffd50,"wait for replication",
               (allocator *)in_stack_fffffffffffffb70);
    TestSuite::sleep_sec((size_t)in_stack_fffffffffffffb60,in_stack_fffffffffffffb58);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffd50);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffd4f);
    std::vector<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_>::begin
              ((vector<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_> *)in_stack_fffffffffffffb58);
    local_2d0 = (RaftAsioPkg **)
                std::vector<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_>::end
                          ((vector<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_> *)
                           in_stack_fffffffffffffb58);
    while( true ) {
      iVar2 = (int)&local_2d0;
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<RaftAsioPkg_**,_std::vector<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_>_>
                          *)in_stack_fffffffffffffb60,
                         (__normal_iterator<RaftAsioPkg_**,_std::vector<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_>_>
                          *)in_stack_fffffffffffffb58);
      if (!bVar1) break;
      local_2d8 = __gnu_cxx::
                  __normal_iterator<RaftAsioPkg_**,_std::vector<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_>_>
                  ::operator*((__normal_iterator<RaftAsioPkg_**,_std::vector<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_>_>
                               *)&stack0xfffffffffffffd38);
      local_2e0 = *local_2d8;
      this = std::__shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1b2ff1);
      nuraft::raft_server::shutdown(this,iVar2,__how);
      if (local_2e0 != (RaftAsioPkg *)0x0) {
        pRVar7 = local_2e0;
        RaftAsioPkg::~RaftAsioPkg(in_stack_fffffffffffffb60);
        operator_delete(pRVar7);
      }
      __gnu_cxx::
      __normal_iterator<RaftAsioPkg_**,_std::vector<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_>_>
      ::operator++((__normal_iterator<RaftAsioPkg_**,_std::vector<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_>_>
                    *)&stack0xfffffffffffffd38);
    }
    paVar6 = &local_301;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_300,"shutting down",paVar6);
    iVar2 = (int)local_300;
    TestSuite::sleep_sec((size_t)paVar6,in_stack_fffffffffffffb58);
    std::__cxx11::string::~string(local_300);
    this_00 = (allocator<char> *)&local_301;
    std::allocator<char>::~allocator(this_00);
    __fd = (int)this_00;
    SimpleLogger::shutdown(__fd,iVar2);
    nuraft::nuraft_global_mgr::shutdown(__fd,iVar2);
    local_4 = 0;
  }
  else {
    poVar4 = (ostream *)std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
    poVar4 = std::operator<<(poVar4,"        time: ");
    poVar4 = std::operator<<(poVar4,"\x1b[1;30m");
    TestSuite::getTimeString_abi_cxx11_();
    poVar4 = std::operator<<(poVar4,local_f8);
    poVar4 = std::operator<<(poVar4,"\x1b[0m");
    poVar4 = std::operator<<(poVar4,"\n");
    poVar4 = std::operator<<(poVar4,"      thread: ");
    poVar4 = std::operator<<(poVar4,"\x1b[33m");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::hex);
    local_fc = (int)std::setw(4);
    poVar4 = std::operator<<(poVar4,(_Setw)local_fc);
    local_fd = (char)std::setfill<char>('0');
    poVar4 = std::operator<<(poVar4,local_fd);
    local_108 = (native_handle_type)std::this_thread::get_id();
    sVar5 = std::hash<std::thread::id>::operator()
                      ((hash<std::thread::id> *)in_stack_fffffffffffffb60,
                       (id *)in_stack_fffffffffffffb58);
    pvVar3 = (void *)std::ostream::operator<<(poVar4,sVar5 & 0xffff);
    poVar4 = (ostream *)std::ostream::operator<<(pvVar3,std::dec);
    poVar4 = std::operator<<(poVar4,"\x1b[0m");
    poVar4 = std::operator<<(poVar4,"\n");
    poVar4 = std::operator<<(poVar4,"          in: ");
    poVar4 = std::operator<<(poVar4,"\x1b[36m");
    poVar4 = std::operator<<(poVar4,"global_mgr_heavy_test");
    poVar4 = std::operator<<(poVar4,"()\x1b[0m");
    poVar4 = std::operator<<(poVar4,"\n");
    poVar4 = std::operator<<(poVar4,"          at: ");
    poVar4 = std::operator<<(poVar4,"\x1b[32m");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/asio_service_test.cxx"
                            );
    poVar4 = std::operator<<(poVar4,"\x1b[0m:");
    poVar4 = std::operator<<(poVar4,"\x1b[1;35m");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x4a4);
    poVar4 = std::operator<<(poVar4,"\x1b[0m");
    poVar4 = std::operator<<(poVar4,"\n");
    poVar4 = std::operator<<(poVar4,
                             "    value of: \x1b[1;34mlaunch_servers(pkgs, false, true)\x1b[0m\n");
    poVar4 = std::operator<<(poVar4,"    expected: \x1b[1;32m");
    poVar4 = std::operator<<(poVar4,"0");
    poVar4 = std::operator<<(poVar4,"\x1b[0m\n");
    poVar4 = std::operator<<(poVar4,"      actual: \x1b[1;31m");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_a4);
    std::operator<<(poVar4,"\x1b[0m\n");
    std::__cxx11::string::~string(local_f8);
    TestSuite::failHandler();
    local_4 = -1;
  }
  local_10c = 1;
  std::vector<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_>::~vector
            ((vector<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_> *)in_stack_fffffffffffffb70);
  return local_4;
}

Assistant:

int global_mgr_heavy_test() {
    reset_log_files();

    nuraft_global_config g_config;
    g_config.num_commit_threads_ = 2;
    g_config.num_append_threads_ = 2;
    nuraft_global_mgr::init(g_config);
    const size_t NUM_SERVERS = 50;

    std::vector<RaftAsioPkg*> pkgs;
    for (size_t ii = 0; ii < NUM_SERVERS; ++ii) {
        std::string addr = "127.0.0.1:" + std::to_string(20000 + (ii+1) * 10);
        RaftAsioPkg* pkg = new RaftAsioPkg(ii+1, addr);
        pkgs.push_back(pkg);
    }

    CHK_Z( launch_servers(pkgs, false, true) );
    TestSuite::sleep_sec(1, "wait for Raft group ready");

    // Set async.
    for (auto& entry: pkgs) {
        RaftAsioPkg* pp = entry;
        raft_params param = pp->raftServer->get_current_params();
        param.return_method_ = raft_params::async_handler;
        pp->raftServer->update_params(param);
    }

    for (size_t ii=0; ii<500; ++ii) {
        std::string msg_str = std::to_string(ii);
        ptr<buffer> msg = buffer::alloc(sizeof(uint32_t) + msg_str.size());
        buffer_serializer bs(msg);
        bs.put_str(msg_str);

        for (auto& entry: pkgs) {
            RaftAsioPkg* pkg = entry;
            pkg->raftServer->append_entries( {msg} );
        }
    }
    TestSuite::sleep_sec(1, "wait for replication");

    for (auto& entry: pkgs) {
        RaftAsioPkg* pkg = entry;
        pkg->raftServer->shutdown();
        delete pkg;
    }
    TestSuite::sleep_sec(1, "shutting down");

    SimpleLogger::shutdown();
    nuraft_global_mgr::shutdown();
    return 0;
}